

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_emit_scalar(yaml_emitter_t *emitter,yaml_event_t *event)

{
  int *piVar1;
  yaml_emitter_state_t *pyVar2;
  int iVar3;
  yaml_event_t *event_local;
  yaml_emitter_t *emitter_local;
  
  iVar3 = yaml_emitter_select_scalar_style(emitter,event);
  if (iVar3 == 0) {
    emitter_local._4_4_ = 0;
  }
  else {
    iVar3 = yaml_emitter_process_anchor(emitter);
    if (iVar3 == 0) {
      emitter_local._4_4_ = 0;
    }
    else {
      iVar3 = yaml_emitter_process_tag(emitter);
      if (iVar3 == 0) {
        emitter_local._4_4_ = 0;
      }
      else {
        iVar3 = yaml_emitter_increase_indent(emitter,1,0);
        if (iVar3 == 0) {
          emitter_local._4_4_ = 0;
        }
        else {
          iVar3 = yaml_emitter_process_scalar(emitter);
          if (iVar3 == 0) {
            emitter_local._4_4_ = 0;
          }
          else {
            piVar1 = (emitter->indents).top;
            (emitter->indents).top = piVar1 + -1;
            emitter->indent = piVar1[-1];
            pyVar2 = (emitter->states).top;
            (emitter->states).top = pyVar2 + -1;
            emitter->state = pyVar2[-1];
            emitter_local._4_4_ = 1;
          }
        }
      }
    }
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_emit_scalar(yaml_emitter_t *emitter, yaml_event_t *event)
{
    if (!yaml_emitter_select_scalar_style(emitter, event))
        return 0;
    if (!yaml_emitter_process_anchor(emitter))
        return 0;
    if (!yaml_emitter_process_tag(emitter))
        return 0;
    if (!yaml_emitter_increase_indent(emitter, 1, 0))
        return 0;
    if (!yaml_emitter_process_scalar(emitter))
        return 0;
    emitter->indent = POP(emitter, emitter->indents);
    emitter->state = POP(emitter, emitter->states);

    return 1;
}